

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::TupleDataTemplatedWithinCollectionScatter<float>
               (Vector *param_1,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *param_5,Vector *param_6,Vector *heap_locations,
               idx_t param_8,UnifiedVectorFormat *list_data,
               vector<duckdb::TupleDataScatterFunction,_true> *param_10)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  idx_t count;
  byte bVar7;
  bool bVar8;
  ulong uVar9;
  idx_t iVar10;
  long *plVar11;
  idx_t child_i;
  ulong uVar12;
  long lVar13;
  idx_t iVar14;
  ValidityBytes child_mask;
  TemplatedValidityMask<unsigned_char> local_50;
  
  pSVar1 = list_data->sel;
  pdVar2 = list_data->data;
  pSVar3 = (source_format->unified).sel;
  pdVar4 = (source_format->unified).data;
  pdVar5 = heap_locations->data;
  for (iVar10 = 0; iVar10 != append_count; iVar10 = iVar10 + 1) {
    iVar14 = iVar10;
    if (append_sel->sel_vector != (sel_t *)0x0) {
      iVar14 = (idx_t)append_sel->sel_vector[iVar10];
    }
    psVar6 = pSVar1->sel_vector;
    if (psVar6 != (sel_t *)0x0) {
      iVar14 = (idx_t)psVar6[iVar14];
    }
    bVar8 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(list_data->validity).super_TemplatedValidityMask<unsigned_long>,iVar14);
    if (bVar8) {
      count = *(idx_t *)(pdVar2 + iVar14 * 0x10 + 8);
      if (count != 0) {
        local_50.validity_mask = *(uchar **)(pdVar5 + iVar10 * 8);
        local_50.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_50.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_50.capacity = count;
        TemplatedValidityMask<unsigned_char>::SetAllValid(&local_50,count);
        plVar11 = (long *)(pdVar2 + iVar14 * 0x10);
        uVar9 = plVar11[1];
        lVar13 = (uVar9 + 7 >> 3) + *(long *)(pdVar5 + iVar10 * 8);
        *(ulong *)(pdVar5 + iVar10 * 8) = uVar9 * 4 + lVar13;
        for (uVar12 = 0; uVar12 < uVar9; uVar12 = uVar12 + 1) {
          iVar14 = *plVar11 + uVar12;
          psVar6 = pSVar3->sel_vector;
          if (psVar6 != (sel_t *)0x0) {
            iVar14 = (idx_t)psVar6[iVar14];
          }
          bVar8 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&(source_format->unified).validity.
                              super_TemplatedValidityMask<unsigned_long>,iVar14);
          if (bVar8) {
            *(undefined4 *)(lVar13 + uVar12 * 4) = *(undefined4 *)(pdVar4 + iVar14 * 4);
          }
          else {
            bVar7 = (byte)uVar12 & 7;
            local_50.validity_mask[uVar12 >> 3] =
                 local_50.validity_mask[uVar12 >> 3] & (-2 << bVar7 | 0xfeU >> 8 - bVar7);
          }
          uVar9 = plVar11[1];
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_50.validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
    }
  }
  return;
}

Assistant:

static void TupleDataTemplatedWithinCollectionScatter(const Vector &, const TupleDataVectorFormat &source_format,
                                                      const SelectionVector &append_sel, const idx_t append_count,
                                                      const TupleDataLayout &, const Vector &, Vector &heap_locations,
                                                      const idx_t, const UnifiedVectorFormat &list_data,
                                                      const vector<TupleDataScatterFunction> &) {
	// Parent list data
	const auto &list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto data = UnifiedVectorFormat::GetData<T>(source_data);
	const auto &source_validity = source_data.validity;

	// Target
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue; // Original list entry is invalid - no need to serialize the child
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip heap pointer over it
		auto &target_heap_location = target_heap_locations[i];
		ValidityBytes child_mask(target_heap_location, list_length);
		child_mask.SetAllValid(list_length);
		target_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Get the start to the fixed-size data and skip the heap pointer over it
		const auto child_data_location = target_heap_location;
		target_heap_location += list_length * TupleDataWithinListFixedSize<T>();

		// Store the data and validity belonging to this list entry
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_source_idx = source_sel.get_index(list_offset + child_i);
			if (source_validity.RowIsValid(child_source_idx)) {
				TupleDataWithinListValueStore<T>(data[child_source_idx],
				                                 child_data_location + child_i * TupleDataWithinListFixedSize<T>(),
				                                 target_heap_location);
			} else {
				child_mask.SetInvalidUnsafe(child_i);
			}
		}
	}
}